

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

void embree::OBJMaterial__preprocess
               (ISPCOBJMaterial *material,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,
               Medium *medium)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  undefined4 *in_RSI;
  long in_RDI;
  float fVar5;
  float d;
  undefined8 local_3d8;
  undefined8 uStackY_3d0;
  float in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc3c;
  Texture *in_stack_fffffffffffffc40;
  float in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc4c;
  Texture *in_stack_fffffffffffffc50;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_344;
  undefined4 *local_328;
  long local_320;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  float local_224;
  undefined8 *local_220;
  float local_214;
  undefined8 *local_210;
  undefined8 *local_208;
  undefined8 *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_344 = *(float *)(in_RDI + 0x14);
  local_328 = in_RSI;
  local_320 = in_RDI;
  if (*(long *)(in_RDI + 0x60) != 0) {
    fVar5 = getTextureTexel1f(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                              in_stack_fffffffffffffc38);
    local_344 = fVar5 * local_344;
  }
  puVar3 = local_328;
  local_208 = (undefined8 *)(local_320 + 0x20);
  local_2d8 = &local_358;
  local_358 = *local_208;
  uStack_350 = *(undefined8 *)(local_320 + 0x28);
  local_2d0 = (undefined8 *)(local_328 + 4);
  *local_2d0 = local_358;
  *(undefined8 *)(local_328 + 6) = uStack_350;
  local_1f8 = (undefined8 *)(local_320 + 0x30);
  local_230 = &local_378;
  uVar1 = *local_1f8;
  uVar2 = *(undefined8 *)(local_320 + 0x38);
  local_220 = &local_368;
  local_224 = local_344;
  local_210 = &local_248;
  local_214 = local_344;
  local_158 = local_344;
  local_168 = local_344;
  fStack_164 = local_344;
  fStack_160 = local_344;
  fStack_15c = local_344;
  local_18 = CONCAT44(local_344,local_344);
  uStack_10 = CONCAT44(local_344,local_344);
  local_1b8 = &local_368;
  local_1c0 = &local_248;
  local_28 = (float)local_378;
  fStack_24 = (float)((ulong)local_378 >> 0x20);
  fStack_20 = (float)uStack_370;
  fStack_1c = (float)((ulong)uStack_370 >> 0x20);
  local_a8 = local_344 * local_28;
  fStack_a4 = local_344 * fStack_24;
  fStack_a0 = local_344 * fStack_20;
  fStack_9c = local_344 * fStack_1c;
  local_90 = &local_368;
  local_368 = CONCAT44(fStack_a4,local_a8);
  uStack_360 = CONCAT44(fStack_9c,fStack_a0);
  local_2e0 = (undefined8 *)(local_328 + 8);
  local_2e8 = &local_368;
  *local_2e0 = local_368;
  *(undefined8 *)(local_328 + 10) = uStack_360;
  if (*(long *)(local_320 + 0x70) != 0) {
    puVar4 = (undefined8 *)(local_328 + 8);
    local_200 = local_2d8;
    local_1f0 = local_230;
    local_1c8 = local_230;
    local_378 = uVar1;
    uStack_370 = uVar2;
    local_248 = local_18;
    uStack_240 = uStack_10;
    getTextureTexel3f(in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
    ;
    local_78 = (float)*puVar4;
    fStack_74 = (float)((ulong)*puVar4 >> 0x20);
    fStack_70 = (float)*(undefined8 *)(puVar3 + 10);
    fStack_6c = (float)((ulong)*(undefined8 *)(puVar3 + 10) >> 0x20);
    local_88 = (float)local_398;
    fStack_84 = (float)((ulong)local_398 >> 0x20);
    fStack_80 = (float)uStack_390;
    fStack_7c = (float)((ulong)uStack_390 >> 0x20);
    *(ulong *)(local_328 + 8) = CONCAT44(fStack_74 * fStack_84,local_78 * local_88);
    *(ulong *)(local_328 + 10) = CONCAT44(fStack_6c * fStack_7c,fStack_70 * fStack_80);
  }
  fStack_40 = SUB84(in_stack_fffffffffffffc50,0);
  fStack_3c = (float)((ulong)in_stack_fffffffffffffc50 >> 0x20);
  *(ulong *)(local_328 + 0xc) =
       CONCAT44(local_344 * in_stack_fffffffffffffc4c,local_344 * in_stack_fffffffffffffc48);
  *(ulong *)(local_328 + 0xe) = CONCAT44(local_344 * fStack_3c,local_344 * fStack_40);
  *local_328 = *(undefined4 *)(local_320 + 0x18);
  local_344 = 1.0 - local_344;
  local_68 = (float)local_3d8;
  fStack_64 = (float)((ulong)local_3d8 >> 0x20);
  fStack_60 = (float)uStackY_3d0;
  fStack_5c = (float)((ulong)uStackY_3d0 >> 0x20);
  *(ulong *)(local_328 + 0x10) = CONCAT44(local_344 * fStack_64,local_344 * local_68);
  *(ulong *)(local_328 + 0x12) = CONCAT44(local_344 * fStack_5c,local_344 * fStack_60);
  local_328[1] = *(undefined4 *)(local_320 + 0x1c);
  return;
}

Assistant:

void OBJMaterial__preprocess(ISPCOBJMaterial* material, BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Medium& medium)
{
    float d = material->d;
    if (material->map_d) d *= getTextureTexel1f(material->map_d,dg.u,dg.v);
    brdf.Ka = Vec3fa(material->Ka);
    //if (material->map_Ka) { brdf.Ka *= material->map_Ka->get(dg.st); }
    brdf.Kd = d * Vec3fa(material->Kd);
    if (material->map_Kd) brdf.Kd = brdf.Kd * getTextureTexel3f(material->map_Kd,dg.u,dg.v);
    brdf.Ks = d * Vec3fa(material->Ks);
    //if (material->map_Ks) brdf.Ks *= material->map_Ks->get(dg.st);
    brdf.Ns = material->Ns;
    //if (material->map_Ns) { brdf.Ns *= material->map_Ns.get(dg.st); }
    brdf.Kt = (1.0f-d)*Vec3fa(material->Kt);
    brdf.Ni = material->Ni;
}